

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O2

void __thiscall HttpHeaderBase::buildHeader(HttpHeaderBase *this)

{
  string *psVar1;
  int iVar2;
  long lVar3;
  char **ppcVar4;
  
  iVar2 = (*this->_vptr_HttpHeaderBase[4])();
  if (0 < iVar2) {
    psVar1 = &this->mHeaderStr;
    ppcVar4 = &this->mFields[0].mData;
    for (lVar3 = 0; lVar3 < this->mNumFields; lVar3 = lVar3 + 1) {
      getFieldTypeString(this,((HeaderField *)(ppcVar4 + -1))->mType);
      std::__cxx11::string::append((char *)psVar1);
      std::__cxx11::string::append((char *)psVar1);
      std::__cxx11::string::append((char *)psVar1);
      std::__cxx11::string::append((char *)psVar1);
      ppcVar4 = ppcVar4 + 2;
    }
    std::__cxx11::string::append((char *)psVar1);
    return;
  }
  (this->mHeaderStr)._M_string_length = 0;
  *(this->mHeaderStr)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void HttpHeaderBase::buildHeader() const
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	if (buildFirstLine() <= 0)
	{
		mHeaderStr.clear();
		return;
	}
	
	for (int i = 0; i < mNumFields; i++)
	{
		mHeaderStr += getFieldTypeString(mFields[i].mType);
		mHeaderStr += ": ";
		mHeaderStr += mFields[i].mData;
		mHeaderStr += "\r\n";
	}
		mHeaderStr += "\r\n";	
}